

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_size_resp(Curl_easy *data,int ftpcode,ftpstate instate)

{
  bool bVar1;
  int iVar2;
  CURLcode CVar3;
  void *pvVar4;
  char local_d8 [4];
  int clbuflen;
  char clbuf [128];
  char *local_50;
  char *fdigit;
  char *start;
  size_t len;
  char *buf;
  curl_off_t filesize;
  ftpstate local_1d;
  CURLcode result;
  ftpstate instate_local;
  Curl_easy *pCStack_18;
  int ftpcode_local;
  Curl_easy *data_local;
  
  filesize._4_4_ = CURLE_OK;
  buf = (char *)0xffffffffffffffff;
  local_1d = instate;
  result = ftpcode;
  pCStack_18 = data;
  len = (size_t)Curl_dyn_ptr(&(data->conn->proto).ftpc.pp.recvbuf);
  start = *(char **)((long)&pCStack_18->conn->proto + 0x80);
  if (result == 0xd5) {
    fdigit = (char *)(len + 4);
    pvVar4 = memchr(fdigit,0xd,(size_t)start);
    if (pvVar4 == (void *)0x0) {
      local_50 = fdigit;
    }
    else {
      local_50 = (char *)((long)pvVar4 + -1);
      if (*local_50 == '\n') {
        local_50 = (char *)((long)pvVar4 + -2);
      }
      while( true ) {
        bVar1 = false;
        if (('/' < local_50[-1]) && (bVar1 = false, local_50[-1] < ':')) {
          bVar1 = fdigit < local_50;
        }
        if (!bVar1) break;
        local_50 = local_50 + -1;
      }
    }
    iVar2 = Curl_str_number(&local_50,(curl_off_t *)&buf,0x7fffffffffffffff);
    if (iVar2 != 0) {
      buf = (char *)0xffffffffffffffff;
    }
  }
  else if ((result == 0x226) && (local_1d != '\x19')) {
    Curl_failf(pCStack_18,"The file does not exist");
    return CURLE_REMOTE_FILE_NOT_FOUND;
  }
  if (local_1d == '\x17') {
    if (buf != (char *)0xffffffffffffffff) {
      iVar2 = curl_msnprintf(local_d8,0x80,"Content-Length: %ld\r\n",buf);
      CVar3 = client_write_header(pCStack_18,local_d8,(long)iVar2);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      filesize._4_4_ = CURLE_OK;
    }
    Curl_pgrsSetDownloadSize(pCStack_18,(curl_off_t)buf);
    filesize._4_4_ = ftp_state_rest(pCStack_18,pCStack_18->conn);
  }
  else if (local_1d == '\x18') {
    Curl_pgrsSetDownloadSize(pCStack_18,(curl_off_t)buf);
    filesize._4_4_ = ftp_state_retr(pCStack_18,(curl_off_t)buf);
  }
  else if (local_1d == '\x19') {
    (pCStack_18->state).resume_from = (curl_off_t)buf;
    filesize._4_4_ = ftp_state_ul_setup(pCStack_18,true);
  }
  return filesize._4_4_;
}

Assistant:

static CURLcode ftp_state_size_resp(struct Curl_easy *data,
                                    int ftpcode,
                                    ftpstate instate)
{
  CURLcode result = CURLE_OK;
  curl_off_t filesize = -1;
  char *buf = Curl_dyn_ptr(&data->conn->proto.ftpc.pp.recvbuf);
  size_t len = data->conn->proto.ftpc.pp.nfinal;

  /* get the size from the ascii string: */
  if(ftpcode == 213) {
    /* To allow servers to prepend "rubbish" in the response string, we scan
       for all the digits at the end of the response and parse only those as a
       number. */
    char *start = &buf[4];
    const char *fdigit = memchr(start, '\r', len);
    if(fdigit) {
      fdigit--;
      if(*fdigit == '\n')
        fdigit--;
      while(ISDIGIT(fdigit[-1]) && (fdigit > start))
        fdigit--;
    }
    else
      fdigit = start;
    if(Curl_str_number(&fdigit, &filesize, CURL_OFF_T_MAX))
      filesize = -1; /* size remain unknown */
  }
  else if(ftpcode == 550) { /* "No such file or directory" */
    /* allow a SIZE failure for (resumed) uploads, when probing what command
       to use */
    if(instate != FTP_STOR_SIZE) {
      failf(data, "The file does not exist");
      return CURLE_REMOTE_FILE_NOT_FOUND;
    }
  }

  if(instate == FTP_SIZE) {
#ifdef CURL_FTP_HTTPSTYLE_HEAD
    if(-1 != filesize) {
      char clbuf[128];
      int clbuflen = msnprintf(clbuf, sizeof(clbuf),
                "Content-Length: %" FMT_OFF_T "\r\n", filesize);
      result = client_write_header(data, clbuf, clbuflen);
      if(result)
        return result;
    }
#endif
    Curl_pgrsSetDownloadSize(data, filesize);
    result = ftp_state_rest(data, data->conn);
  }
  else if(instate == FTP_RETR_SIZE) {
    Curl_pgrsSetDownloadSize(data, filesize);
    result = ftp_state_retr(data, filesize);
  }
  else if(instate == FTP_STOR_SIZE) {
    data->state.resume_from = filesize;
    result = ftp_state_ul_setup(data, TRUE);
  }

  return result;
}